

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

int ncnn::conv3x3s1_winograd23(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar6;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined1 auVar7 [32];
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  void *pvVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  undefined1 (*pauVar19) [32];
  undefined1 (*pauVar20) [16];
  undefined8 *puVar21;
  undefined8 *puVar22;
  float *pfVar23;
  float *pfVar24;
  long lVar25;
  ulong uVar26;
  float *pfVar27;
  int iVar28;
  long lVar29;
  int m_4;
  uint uVar30;
  int iVar31;
  uint uVar32;
  int m_3;
  uint uVar33;
  Option *pOVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  float fVar38;
  float fVar40;
  float fVar41;
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  Mat m_1;
  float tmp [2] [4] [8];
  Allocator *_allocator;
  int local_3a0;
  uint local_39c;
  void *local_398;
  Option *local_390;
  ulong local_388;
  void *local_380;
  Mat *local_378;
  ulong local_370;
  ulong local_368;
  void *local_360;
  ulong local_358;
  int local_350;
  int local_34c;
  int local_348;
  uint local_344;
  Mat local_340;
  long local_2f0;
  void *local_2e8;
  ulong local_2e0;
  long local_2d8;
  Mat *local_2d0;
  int local_2c4;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  Mat local_2a0;
  Mat local_250;
  ulong local_200;
  long local_1f8;
  long local_1f0;
  void *local_1e8;
  undefined1 local_1e0 [8];
  float afStack_1d8 [2];
  undefined8 uStack_1d0;
  float afStack_1c8 [2];
  Allocator *local_1c0;
  int iStack_1b8;
  int iStack_1b4;
  float fStack_1b0;
  int iStack_1ac;
  int iStack_1a8;
  size_t local_1a0 [4];
  float local_180 [8];
  undefined1 auStack_160 [128];
  Mat local_e0;
  ulong local_98;
  Mat *local_90;
  void *local_88;
  long local_80;
  long local_78;
  long local_70;
  ulong local_68;
  Mat *local_60;
  undefined1 auVar58 [32];
  
  uVar2 = top_blob->w;
  uVar6 = top_blob->h;
  auVar47._4_4_ = uVar6;
  auVar47._0_4_ = uVar2;
  auVar39 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar47._8_8_ = 0;
  auVar39 = vpsubd_avx(auVar47,auVar39);
  auVar47 = vpsrld_avx(auVar39,0x1f);
  auVar39 = vpaddd_avx(auVar39,auVar47);
  auVar39 = vpsrad_avx(auVar39,1);
  uVar33 = top_blob->elempack * top_blob->c;
  uVar32 = auVar39._4_4_ * auVar39._0_4_;
  uVar30 = bottom_blob->elempack * bottom_blob->c;
  local_398 = (void *)CONCAT44(local_398._4_4_,nT);
  local_390 = opt;
  local_378 = bottom_blob;
  local_2d0 = top_blob;
  local_90 = bias;
  local_60 = AT;
  get_optimal_tile_mnk(uVar33,uVar32,uVar30,(int *)&local_344,(int *)&local_39c,&local_3a0,nT);
  pOVar34 = local_390;
  local_2c4 = (int)(uVar33 + local_344 + -1) / (int)local_344;
  iVar31 = (int)(uVar32 + local_39c + -1) / (int)local_39c;
  iVar13 = (int)(local_3a0 + uVar30 + -1) / local_3a0;
  iVar17 = local_3a0 * local_39c;
  _allocator = local_390->workspace_allocator;
  local_250.cstep = 0;
  local_250.data = (void *)0x0;
  local_250.refcount._0_4_ = 0;
  local_250.refcount._4_4_ = 0;
  local_250.elemsize = 0;
  local_250.elempack = 0;
  local_250.allocator = (Allocator *)0x0;
  local_250.dims = 0;
  local_250.w = 0;
  local_250.h = 0;
  local_250.d = 0;
  local_250.c = 0;
  local_2c0 = (ulong)uVar32;
  local_2b8 = (ulong)uVar30;
  local_98 = (ulong)uVar33;
  Mat::create(&local_250,iVar17,0x10,iVar13,iVar31,4,_allocator);
  iVar28 = -100;
  if ((local_250.data == (void *)0x0) || ((long)local_250.c * local_250.cstep == 0))
  goto LAB_002195a1;
  iVar31 = iVar31 * iVar13;
  iVar17 = iVar17 * 0x10;
  local_388 = CONCAT44(local_388._4_4_,iVar31);
  if (((int)local_398 < 2) || ((int)local_398 <= iVar31)) {
    local_1a0[0] = 0;
    local_1e0 = (undefined1  [8])0x0;
    afStack_1d8[0] = 0.0;
    afStack_1d8[1] = 0.0;
    uStack_1d0 = 0;
    afStack_1c8[0] = 0.0;
    local_1c0 = (Allocator *)0x0;
    iStack_1b8 = 0;
    iStack_1b4 = 0;
    fStack_1b0 = 0.0;
    iStack_1ac = 0;
    iStack_1a8 = 0;
    Mat::create((Mat *)local_1e0,iVar17,1,(int)local_398,4,pOVar34->workspace_allocator);
    bVar36 = (long)iStack_1a8 * local_1a0[0] == 0;
    if (local_1e0 != (undefined1  [8])0x0 && !bVar36) {
      local_358 = CONCAT71(local_358._1_7_,local_1e0 == (undefined1  [8])0x0 || bVar36);
      if (0 < iVar31) {
        iVar17 = 0;
        do {
          iVar28 = local_39c * (iVar17 / iVar13);
          iVar31 = local_3a0 * (iVar17 % iVar13);
          uVar30 = (int)local_2c0 - iVar28;
          if ((int)local_39c < (int)uVar30) {
            uVar30 = local_39c;
          }
          iVar18 = (int)local_2b8 - iVar31;
          if (local_3a0 < iVar18) {
            iVar18 = local_3a0;
          }
          iVar14 = get_omp_thread_num();
          local_380 = (void *)CONCAT44(local_380._4_4_,iVar17 % iVar13);
          local_340.data = (void *)((long)iVar14 * local_1a0[0] * uStack_1d0 + (long)local_1e0);
          local_340.refcount._0_4_ = 0;
          local_340.refcount._4_4_ = 0;
          local_340.elemsize = uStack_1d0;
          local_340.elempack = (int)afStack_1c8[0];
          local_340.allocator = local_1c0;
          local_340.w = iStack_1b4;
          local_340.h = (int)fStack_1b0;
          local_340.d = 1;
          local_340.c = iStack_1ac;
          local_340.dims = iStack_1b8 + -1;
          local_340.cstep =
               (uStack_1d0 * (long)(int)fStack_1b0 * (long)iStack_1b4 + 0xf & 0xfffffffffffffff0) /
               uStack_1d0;
          if (iStack_1b8 == 4) {
            local_340.cstep = (long)(int)fStack_1b0 * (long)iStack_1b4;
          }
          conv3x3s1_winograd23_transform_input_tile
                    (local_378,&local_340,iVar28,uVar30,iVar31,iVar18,(int)_allocator);
          local_2a0.cstep = (long)local_250.h * (long)local_250.w;
          local_2a0.data =
               (void *)((long)local_250.data +
                       ((ulong)local_380 & 0xffffffff) * local_250.elemsize * local_2a0.cstep +
                       (long)(iVar17 / iVar13) * local_250.cstep * local_250.elemsize);
          local_2a0.refcount._0_4_ = 0;
          local_2a0.refcount._4_4_ = 0;
          local_2a0.elemsize = local_250.elemsize;
          local_2a0.elempack = local_250.elempack;
          local_2a0.allocator = local_250.allocator;
          local_2a0.dims = 2;
          local_2a0.w = local_250.w;
          local_2a0.h = local_250.h;
          local_2a0.d = 1;
          local_2a0.c = 1;
          transpose_pack_B_tile(&local_340,&local_2a0,0x10,uVar30,iVar18,(int)local_2a0.cstep);
          piVar11 = (int *)CONCAT44(local_2a0.refcount._4_4_,local_2a0.refcount._0_4_);
          iVar31 = (int)local_388;
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              if (local_2a0.allocator == (Allocator *)0x0) {
                if (local_2a0.data != (void *)0x0) {
                  free(local_2a0.data);
                }
              }
              else {
                (*(local_2a0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2a0.cstep = 0;
          local_2a0.data = (void *)0x0;
          local_2a0.refcount._0_4_ = 0;
          local_2a0.refcount._4_4_ = 0;
          local_2a0.elemsize = 0;
          local_2a0.elempack = 0;
          local_2a0.dims = 0;
          local_2a0.w = 0;
          local_2a0.h = 0;
          local_2a0.d = 0;
          local_2a0.c = 0;
          piVar11 = (int *)CONCAT44(local_340.refcount._4_4_,local_340.refcount._0_4_);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              if (local_340.allocator == (Allocator *)0x0) {
                if (local_340.data != (void *)0x0) {
                  free(local_340.data);
                }
              }
              else {
                (*(local_340.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_340.cstep = 0;
          local_340.data = (void *)0x0;
          local_340.refcount._0_4_ = 0;
          local_340.refcount._4_4_ = 0;
          local_340.elemsize = 0;
          local_340.elempack = 0;
          local_340.dims = 0;
          local_340.w = 0;
          local_340.h = 0;
          local_340.d = 0;
          local_340.c = 0;
          iVar17 = iVar17 + 1;
        } while (iVar31 != iVar17);
      }
      pOVar34 = local_390;
      piVar11 = (int *)CONCAT44(afStack_1d8[1],afStack_1d8[0]);
      iVar28 = -100;
      iVar13 = (int)local_398;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_1c0 == (Allocator *)0x0) {
            if (local_1e0 != (undefined1  [8])0x0) {
              free((void *)local_1e0);
            }
          }
          else {
            (*local_1c0->_vptr_Allocator[3])();
          }
        }
      }
      local_1a0[0] = 0;
      local_1e0 = (undefined1  [8])0x0;
      afStack_1d8[0] = 0.0;
      afStack_1d8[1] = 0.0;
      uStack_1d0 = 0;
      afStack_1c8[0] = 0.0;
      iStack_1b8 = 0;
      iStack_1b4 = 0;
      fStack_1b0 = 0.0;
      iStack_1ac = 0;
      iStack_1a8 = 0;
      if ((char)local_358 != '\0') goto LAB_002195a1;
      goto LAB_002183b9;
    }
    piVar11 = (int *)CONCAT44(afStack_1d8[1],afStack_1d8[0]);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1c0 == (Allocator *)0x0) goto LAB_002182dc;
        (*local_1c0->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_1a0[0] = 0;
    local_1e0 = (undefined1  [8])0x0;
    afStack_1d8[0] = 0.0;
    afStack_1d8[1] = 0.0;
    uStack_1d0 = 0;
    afStack_1c8[0] = 0.0;
    local_1c0 = (Allocator *)0x0;
    iStack_1b8 = 0;
    iStack_1b4 = 0;
    fStack_1b0 = 0.0;
    iStack_1ac = 0;
    iStack_1a8 = 0;
    Mat::create((Mat *)local_1e0,iVar17,4,pOVar34->workspace_allocator);
    bVar36 = local_1e0 == (undefined1  [8])0x0;
    bVar37 = (long)iStack_1a8 * local_1a0[0] == 0;
    if (!bVar36 && !bVar37) {
      if (0 < iVar31) {
        iVar17 = 0;
        do {
          iVar31 = local_39c * (iVar17 / iVar13);
          iVar28 = local_3a0 * (iVar17 % iVar13);
          uVar30 = (int)local_2c0 - iVar31;
          if ((int)local_39c < (int)uVar30) {
            uVar30 = local_39c;
          }
          iVar18 = (int)local_2b8 - iVar28;
          if (local_3a0 < iVar18) {
            iVar18 = local_3a0;
          }
          conv3x3s1_winograd23_transform_input_tile
                    (local_378,(Mat *)local_1e0,iVar31,uVar30,iVar28,iVar18,(int)_allocator);
          local_340.cstep = (long)local_250.h * (long)local_250.w;
          local_340.data =
               (void *)((long)local_250.data +
                       (uint)(iVar17 % iVar13) * local_250.elemsize * local_340.cstep +
                       (long)(iVar17 / iVar13) * local_250.cstep * local_250.elemsize);
          local_340.refcount._0_4_ = 0;
          local_340.refcount._4_4_ = 0;
          local_340.elemsize = local_250.elemsize;
          local_340.elempack = local_250.elempack;
          local_340.allocator = local_250.allocator;
          local_340.dims = 2;
          local_340.w = local_250.w;
          local_340.h = local_250.h;
          local_340.d = 1;
          local_340.c = 1;
          iVar31 = (int)local_388;
          transpose_pack_B_tile((Mat *)local_1e0,&local_340,0x10,uVar30,iVar18,(int)local_340.cstep)
          ;
          piVar11 = (int *)CONCAT44(local_340.refcount._4_4_,local_340.refcount._0_4_);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              if (local_340.allocator == (Allocator *)0x0) {
                if (local_340.data != (void *)0x0) {
                  free(local_340.data);
                }
              }
              else {
                (*(local_340.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_340.cstep = 0;
          local_340.data = (void *)0x0;
          local_340.refcount._0_4_ = 0;
          local_340.refcount._4_4_ = 0;
          local_340.elemsize = 0;
          local_340.elempack = 0;
          local_340.dims = 0;
          local_340.w = 0;
          local_340.h = 0;
          local_340.d = 0;
          local_340.c = 0;
          iVar17 = iVar17 + 1;
        } while (iVar31 != iVar17);
      }
      pOVar34 = local_390;
      piVar11 = (int *)CONCAT44(afStack_1d8[1],afStack_1d8[0]);
      iVar28 = -100;
      iVar13 = (int)local_398;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_1c0 == (Allocator *)0x0) {
            if (local_1e0 != (undefined1  [8])0x0) {
              free((void *)local_1e0);
            }
          }
          else {
            (*local_1c0->_vptr_Allocator[3])();
          }
        }
      }
      local_1a0[0] = 0;
      local_1e0 = (undefined1  [8])0x0;
      afStack_1d8[0] = 0.0;
      afStack_1d8[1] = 0.0;
      uStack_1d0 = 0;
      afStack_1c8[0] = 0.0;
      iStack_1b8 = 0;
      iStack_1b4 = 0;
      fStack_1b0 = 0.0;
      iStack_1ac = 0;
      iStack_1a8 = 0;
      if (bVar36 || bVar37) goto LAB_002195a1;
LAB_002183b9:
      local_1a0[0] = 0;
      iStack_1a8 = 0;
      iStack_1ac = 0;
      fStack_1b0 = 0.0;
      iStack_1b4 = 0;
      iStack_1b8 = 0;
      afStack_1c8[0] = 0.0;
      uStack_1d0 = 0;
      afStack_1d8[1] = 0.0;
      afStack_1d8[0] = 0.0;
      local_1e0 = (undefined1  [8])0x0;
      iVar28 = -100;
      local_340.cstep = 0;
      local_340.data = (void *)0x0;
      local_340.refcount._0_4_ = 0;
      local_340.refcount._4_4_ = 0;
      local_340.elemsize = 0;
      local_340.elempack = 0;
      local_340.allocator = (Allocator *)0x0;
      local_340.dims = 0;
      local_340.w = 0;
      local_340.h = 0;
      local_340.d = 0;
      local_340.c = 0;
      Mat::create(&local_340,local_39c * local_344 * 0x10,1,iVar13,4,pOVar34->workspace_allocator);
      if ((local_340.data != (void *)0x0) && ((long)local_340.c * local_340.cstep != 0)) {
        if (0 < local_2c4) {
          local_34c = 0;
          do {
            uVar30 = local_344;
            iVar13 = get_omp_thread_num();
            local_2a0.data =
                 (void *)((long)iVar13 * local_340.cstep * local_340.elemsize + (long)local_340.data
                         );
            local_2a0.refcount._0_4_ = 0;
            local_2a0.refcount._4_4_ = 0;
            local_2a0.elemsize = local_340.elemsize;
            local_2a0.elempack = local_340.elempack;
            local_2a0.allocator = local_340.allocator;
            local_2a0.w = local_340.w;
            local_2a0.h = local_340.h;
            local_2a0.d = 1;
            local_2a0.c = local_340.d;
            local_2a0.dims = local_340.dims + -1;
            local_2a0.cstep =
                 (local_340.elemsize * (long)local_340.h * (long)local_340.w + 0xf &
                 0xfffffffffffffff0) / local_340.elemsize;
            if (local_340.dims == 4) {
              local_2a0.cstep = (long)local_340.h * (long)local_340.w;
            }
            uVar33 = uVar30 * local_34c;
            local_2b0 = (ulong)uVar33;
            uVar32 = (int)local_98 - uVar33;
            if ((int)uVar30 < (int)uVar32) {
              uVar32 = uVar30;
            }
            if (0 < (int)local_2c0) {
              local_2f0 = (long)(int)uVar33;
              local_68 = (ulong)uVar32;
              local_1f0 = (long)(int)uVar32;
              uVar35 = 0;
              do {
                uVar30 = (int)local_2c0 - (int)uVar35;
                if ((int)local_39c < (int)uVar30) {
                  uVar30 = local_39c;
                }
                local_370 = (ulong)uVar30;
                local_358 = uVar35;
                if (0 < (int)local_2b8) {
                  iVar13 = 0;
                  do {
                    iVar17 = (int)local_2b8 - iVar13;
                    if (local_3a0 < iVar17) {
                      iVar17 = local_3a0;
                    }
                    iStack_1b4 = local_60->w;
                    fStack_1b0 = (float)local_60->h;
                    uStack_1d0 = local_60->elemsize;
                    afStack_1c8[0] = (float)local_60->elempack;
                    local_1c0 = local_60->allocator;
                    local_1a0[0] = (long)(int)fStack_1b0 * (long)iStack_1b4;
                    local_1e0 = (undefined1  [8])
                                ((long)local_60->data +
                                uStack_1d0 * local_1a0[0] * (long)(iVar13 / local_3a0) +
                                (long)(int)((long)((ulong)(uint)((int)local_2b0 >> 0x1f) << 0x20 |
                                                  local_2b0 & 0xffffffff) / (long)(int)local_344) *
                                local_60->cstep * uStack_1d0);
                    afStack_1d8[0] = 0.0;
                    afStack_1d8[1] = 0.0;
                    iStack_1b8 = 2;
                    iStack_1ac = 1;
                    iStack_1a8 = 1;
                    local_e0.cstep = (long)local_250.h * (long)local_250.w;
                    local_e0.data =
                         (void *)((long)local_250.data +
                                 local_250.elemsize * local_e0.cstep * (long)(iVar13 / local_3a0) +
                                 (long)(int)((long)((ulong)(uint)((int)local_358 >> 0x1f) << 0x20 |
                                                   local_358 & 0xffffffff) / (long)(int)local_39c) *
                                 local_250.cstep * local_250.elemsize);
                    local_e0.refcount._0_4_ = 0;
                    local_e0.refcount._4_4_ = 0;
                    local_e0.elemsize = local_250.elemsize;
                    local_e0.elempack = local_250.elempack;
                    local_e0.allocator = local_250.allocator;
                    local_e0.dims = 2;
                    local_e0.w = local_250.w;
                    local_e0.h = local_250.h;
                    local_e0.d = 1;
                    local_e0.c = 1;
                    gemm_transB_packed_tile
                              ((Mat *)local_1e0,&local_e0,&local_2a0,0x10,uVar32,(int)local_370,
                               iVar13,iVar17);
                    piVar11 = (int *)CONCAT44(local_e0.refcount._4_4_,local_e0.refcount._0_4_);
                    if (piVar11 != (int *)0x0) {
                      LOCK();
                      *piVar11 = *piVar11 + -1;
                      UNLOCK();
                      if (*piVar11 == 0) {
                        if (local_e0.allocator == (Allocator *)0x0) {
                          if (local_e0.data != (void *)0x0) {
                            free(local_e0.data);
                          }
                        }
                        else {
                          (*(local_e0.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    local_e0.cstep = 0;
                    local_e0.data = (void *)0x0;
                    local_e0.refcount._0_4_ = 0;
                    local_e0.refcount._4_4_ = 0;
                    local_e0.elemsize = 0;
                    local_e0.elempack = 0;
                    local_e0.dims = 0;
                    local_e0.w = 0;
                    local_e0.h = 0;
                    local_e0.d = 0;
                    local_e0.c = 0;
                    piVar11 = (int *)CONCAT44(afStack_1d8[1],afStack_1d8[0]);
                    if (piVar11 != (int *)0x0) {
                      LOCK();
                      *piVar11 = *piVar11 + -1;
                      UNLOCK();
                      if (*piVar11 == 0) {
                        if (local_1c0 == (Allocator *)0x0) {
                          if (local_1e0 != (undefined1  [8])0x0) {
                            free((void *)local_1e0);
                          }
                        }
                        else {
                          (*local_1c0->_vptr_Allocator[3])();
                        }
                      }
                    }
                    local_1a0[0] = 0;
                    local_1e0 = (undefined1  [8])0x0;
                    afStack_1d8[0] = 0.0;
                    afStack_1d8[1] = 0.0;
                    uStack_1d0 = 0;
                    afStack_1c8[0] = 0.0;
                    iStack_1b8 = 0;
                    iStack_1b4 = 0;
                    fStack_1b0 = 0.0;
                    iStack_1ac = 0;
                    iStack_1a8 = 0;
                    iVar13 = iVar13 + local_3a0;
                  } while (iVar13 < (int)local_2b8);
                }
                iVar13 = local_2d0->w;
                iVar17 = local_2d0->elempack;
                iVar31 = local_2d0->h;
                uVar30 = (int)local_2d0->cstep * iVar17;
                local_200 = (ulong)uVar30;
                local_350 = (iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1;
                iVar28 = (int)local_370;
                local_348 = iVar28 * 0x10;
                uVar35 = 0;
                local_360 = local_90->data;
                iVar18 = (int)local_358;
                if (7 < (int)uVar32) {
                  lVar29 = (long)(int)uVar30;
                  local_388 = (ulong)(int)(uVar30 * 2);
                  local_380 = (void *)(long)(int)(uVar30 * 5);
                  local_390 = (Option *)(long)(int)(uVar30 * 6);
                  local_398 = (void *)(long)(int)(uVar30 * 7);
                  local_378 = (Mat *)(long)(iVar17 * iVar13);
                  local_1f8 = CONCAT44(local_1f8._4_4_,iVar28 * 0x80);
                  local_70 = (long)(iVar28 * 8) * 4;
                  local_78 = (long)local_348 * 4;
                  local_80 = (long)(iVar28 * 0x18) * 4;
                  local_88 = (void *)((long)local_360 + local_2f0 * 4);
                  local_1e8 = (void *)(local_370 & 0xffffffff);
                  local_2e0 = 0;
                  uVar35 = 0;
                  do {
                    local_2a8 = uVar35;
                    if (local_360 == (void *)0x0) {
                      fVar38 = 0.0;
                      fVar40 = 0.0;
                      fVar41 = 0.0;
                      fVar42 = 0.0;
                      fVar43 = 0.0;
                      fVar44 = 0.0;
                      fVar45 = 0.0;
                      fVar46 = 0.0;
                    }
                    else {
                      pfVar23 = (float *)((long)local_88 + local_2a8 * 4);
                      fVar38 = *pfVar23;
                      fVar40 = pfVar23[1];
                      fVar41 = pfVar23[2];
                      fVar42 = pfVar23[3];
                      fVar43 = pfVar23[4];
                      fVar44 = pfVar23[5];
                      fVar45 = pfVar23[6];
                      fVar46 = pfVar23[7];
                    }
                    if (0 < iVar28) {
                      lVar15 = (long)(int)local_2e0;
                      local_2d8 = (long)(((int)local_2b0 + (int)local_2a8) / iVar17);
                      pvVar12 = (void *)0x0;
                      uVar35 = 0;
                      do {
                        local_368 = uVar35;
                        local_2e8 = pvVar12;
                        iVar14 = iVar18 + (int)local_2e8;
                        lVar16 = (long)local_2a0.data + local_368;
                        lVar25 = -0x80;
                        do {
                          auVar7 = *(undefined1 (*) [32])(lVar16 + local_70 + lVar15 * 4);
                          auVar51 = *(undefined1 (*) [32])
                                     (lVar16 + (long)local_348 * 4 + lVar15 * 4);
                          pfVar23 = (float *)(lVar16 + lVar15 * 4);
                          auVar61._0_4_ = auVar7._0_4_ + *pfVar23 + auVar51._0_4_;
                          auVar61._4_4_ = auVar7._4_4_ + pfVar23[1] + auVar51._4_4_;
                          auVar61._8_4_ = auVar7._8_4_ + pfVar23[2] + auVar51._8_4_;
                          auVar61._12_4_ = auVar7._12_4_ + pfVar23[3] + auVar51._12_4_;
                          auVar61._16_4_ = auVar7._16_4_ + pfVar23[4] + auVar51._16_4_;
                          auVar61._20_4_ = auVar7._20_4_ + pfVar23[5] + auVar51._20_4_;
                          auVar61._24_4_ = auVar7._24_4_ + pfVar23[6] + auVar51._24_4_;
                          auVar61._28_4_ = auVar7._28_4_ + pfVar23[7] + auVar51._28_4_;
                          auVar7 = vsubps_avx(auVar7,auVar51);
                          pfVar23 = (float *)(lVar16 + local_80 + lVar15 * 4);
                          auVar51._0_4_ = auVar7._0_4_ + *pfVar23;
                          auVar51._4_4_ = auVar7._4_4_ + pfVar23[1];
                          auVar51._8_4_ = auVar7._8_4_ + pfVar23[2];
                          auVar51._12_4_ = auVar7._12_4_ + pfVar23[3];
                          auVar51._16_4_ = auVar7._16_4_ + pfVar23[4];
                          auVar51._20_4_ = auVar7._20_4_ + pfVar23[5];
                          auVar51._24_4_ = auVar7._24_4_ + pfVar23[6];
                          auVar51._28_4_ = auVar7._28_4_ + pfVar23[7];
                          *(undefined1 (*) [32])(auStack_160 + lVar25) = auVar61;
                          *(undefined1 (*) [32])((long)&local_e0.data + lVar25) = auVar51;
                          lVar16 = lVar16 + (long)(iVar28 << 5) * 4;
                          lVar25 = lVar25 + 0x20;
                        } while (lVar25 != 0);
                        iVar9 = iVar14 % local_350;
                        uVar33 = (iVar14 / local_350) * 2;
                        pauVar19 = (undefined1 (*) [32])
                                   ((long)local_2d0->data +
                                   (long)(iVar9 * 2 * iVar17) * 4 +
                                   (long)local_2d0->w * local_2d0->elemsize * (long)(int)uVar33 +
                                   local_2d0->cstep * local_2d8 * local_2d0->elemsize);
                        iVar14 = iVar9 * 2 + 1;
                        pfVar23 = local_180;
                        lVar16 = 0;
                        do {
                          if ((int)(uVar33 | (uint)lVar16) < iVar31) {
                            auVar52._0_4_ = fVar38 + pfVar23[-0x10];
                            auVar52._4_4_ = fVar40 + pfVar23[-0xf];
                            auVar52._8_4_ = fVar41 + pfVar23[-0xe];
                            auVar52._12_4_ = fVar42 + pfVar23[-0xd];
                            auVar52._16_4_ = fVar43 + pfVar23[-0xc];
                            auVar52._20_4_ = fVar44 + pfVar23[-0xb];
                            auVar52._24_4_ = fVar45 + pfVar23[-10];
                            auVar52._28_4_ = fVar46 + pfVar23[-9];
                            auVar7 = *(undefined1 (*) [32])(pfVar23 + -8);
                            auVar54._0_4_ = auVar52._0_4_ + pfVar23[-0x18] + auVar7._0_4_;
                            auVar54._4_4_ = auVar52._4_4_ + pfVar23[-0x17] + auVar7._4_4_;
                            auVar54._8_4_ = auVar52._8_4_ + pfVar23[-0x16] + auVar7._8_4_;
                            auVar54._12_4_ = auVar52._12_4_ + pfVar23[-0x15] + auVar7._12_4_;
                            auVar58._16_4_ = auVar52._16_4_ + pfVar23[-0x14] + auVar7._16_4_;
                            auVar58._0_16_ = auVar54;
                            auVar58._20_4_ = auVar52._20_4_ + pfVar23[-0x13] + auVar7._20_4_;
                            auVar58._24_4_ = auVar52._24_4_ + pfVar23[-0x12] + auVar7._24_4_;
                            auVar58._28_4_ = auVar52._28_4_ + pfVar23[-0x11] + auVar7._28_4_;
                            auVar7 = vsubps_avx(auVar52,auVar7);
                            auVar39._0_4_ = auVar7._0_4_ + *pfVar23;
                            auVar39._4_4_ = auVar7._4_4_ + pfVar23[1];
                            auVar39._8_4_ = auVar7._8_4_ + pfVar23[2];
                            auVar39._12_4_ = auVar7._12_4_ + pfVar23[3];
                            auVar53._16_4_ = auVar7._16_4_ + pfVar23[4];
                            auVar53._0_16_ = auVar39;
                            auVar53._20_4_ = auVar7._20_4_ + pfVar23[5];
                            auVar53._24_4_ = auVar7._24_4_ + pfVar23[6];
                            auVar53._28_4_ = auVar7._28_4_ + pfVar23[7];
                            auVar48 = auVar58._16_16_;
                            auVar47 = auVar53._16_16_;
                            if (iVar17 == 1) {
                              *(float *)*pauVar19 = auVar54._0_4_;
                              uVar8 = vextractps_avx(auVar54,1);
                              *(undefined4 *)(*pauVar19 + lVar29 * 4) = uVar8;
                              uVar8 = vextractps_avx(auVar54,2);
                              *(undefined4 *)(*pauVar19 + local_388 * 4) = uVar8;
                              uVar8 = vextractps_avx(auVar54,3);
                              *(undefined4 *)(*pauVar19 + (long)(int)(uVar30 * 3) * 4) = uVar8;
                              *(float *)(*pauVar19 + (long)(int)(uVar30 * 4) * 4) = auVar58._16_4_;
                              uVar8 = vextractps_avx(auVar48,1);
                              *(undefined4 *)(*pauVar19 + (long)local_380 * 4) = uVar8;
                              uVar8 = vextractps_avx(auVar48,2);
                              *(undefined4 *)(*pauVar19 + (long)local_390 * 4) = uVar8;
                              uVar8 = vextractps_avx(auVar48,3);
                              *(undefined4 *)(*pauVar19 + (long)local_398 * 4) = uVar8;
                              if (iVar14 < iVar13) {
                                *(float *)(*pauVar19 + 4) = auVar39._0_4_;
                                uVar8 = vextractps_avx(auVar39,1);
                                *(undefined4 *)(*pauVar19 + lVar29 * 4 + 4) = uVar8;
                                uVar8 = vextractps_avx(auVar39,2);
                                *(undefined4 *)(*pauVar19 + local_388 * 4 + 4) = uVar8;
                                uVar8 = vextractps_avx(auVar39,3);
                                *(undefined4 *)(*pauVar19 + (long)(int)(uVar30 * 3) * 4 + 4) = uVar8
                                ;
                                *(float *)(*pauVar19 + (long)(int)(uVar30 * 4) * 4 + 4) =
                                     auVar53._16_4_;
                                uVar8 = vextractps_avx(auVar47,1);
                                *(undefined4 *)(*pauVar19 + (long)local_380 * 4 + 4) = uVar8;
                                uVar8 = vextractps_avx(auVar47,2);
                                *(undefined4 *)(*pauVar19 + (long)local_390 * 4 + 4) = uVar8;
                                uVar8 = vextractps_avx(auVar47,3);
                                *(undefined4 *)(*pauVar19 + (long)local_398 * 4 + 4) = uVar8;
                              }
                            }
                            else if (iVar17 == 4) {
                              *(undefined1 (*) [16])*pauVar19 = auVar54;
                              *(undefined1 (*) [16])(*pauVar19 + lVar29 * 4) = auVar48;
                              if (iVar14 < iVar13) {
                                *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar39;
                                *(undefined1 (*) [16])(*pauVar19 + lVar29 * 4 + 0x10) = auVar47;
                              }
                            }
                            else if ((iVar17 == 8) && (*pauVar19 = auVar58, iVar14 < iVar13)) {
                              pauVar19[1] = auVar53;
                            }
                            pauVar19 = (undefined1 (*) [32])(*pauVar19 + (long)local_378 * 4);
                          }
                          lVar16 = lVar16 + 1;
                          pfVar23 = pfVar23 + 0x20;
                        } while (lVar16 == 1);
                        pvVar12 = (void *)((long)local_2e8 + 1U);
                        uVar35 = local_368 + 0x20;
                      } while ((void *)((long)local_2e8 + 1U) != local_1e8);
                    }
                    uVar35 = local_2a8 + 8;
                    local_2e0 = (ulong)(uint)((int)local_2e0 + iVar28 * 0x80);
                  } while (local_2a8 + 0xf < local_68);
                }
                if ((int)((uint)uVar35 | 3) < (int)uVar32) {
                  local_1e8 = (void *)((long)local_360 + local_2f0 * 4);
                  local_378 = (Mat *)(long)(int)uVar30;
                  local_388 = (ulong)(int)(uVar30 * 2);
                  local_398 = (void *)(local_370 & 0xffffffff);
                  uVar33 = (uint)uVar35 * iVar28 * 0x10;
                  local_2d8 = CONCAT44(local_2d8._4_4_,iVar28 * 0x40);
                  local_2e0 = (long)(iVar28 * 4) * 4;
                  local_2a8 = (long)(iVar28 * 8) * 4;
                  local_1f8 = (long)(iVar28 * 0xc) * 4;
                  pvVar12 = (void *)(uVar35 & 0xffffffff);
                  do {
                    local_2e8 = pvVar12;
                    local_368 = (ulong)uVar33;
                    if (local_360 == (void *)0x0) {
                      fVar38 = 0.0;
                      fVar40 = 0.0;
                      fVar41 = 0.0;
                      fVar42 = 0.0;
                    }
                    else {
                      pfVar23 = (float *)((long)local_1e8 + (long)local_2e8 * 4);
                      fVar38 = *pfVar23;
                      fVar40 = pfVar23[1];
                      fVar41 = pfVar23[2];
                      fVar42 = pfVar23[3];
                    }
                    if (0 < iVar28) {
                      lVar29 = (long)(int)uVar33;
                      local_390 = (Option *)(long)(((int)local_2b0 + (int)local_2e8) / iVar17);
                      lVar15 = 0;
                      pvVar12 = (void *)0x0;
                      do {
                        local_380 = pvVar12;
                        iVar14 = iVar18 + (int)local_380;
                        lVar16 = (long)local_2a0.data + lVar15;
                        lVar25 = -0x40;
                        do {
                          auVar39 = *(undefined1 (*) [16])(lVar16 + local_2e0 + lVar29 * 4);
                          auVar47 = *(undefined1 (*) [16])(lVar16 + local_2a8 + lVar29 * 4);
                          pfVar23 = (float *)(lVar16 + lVar29 * 4);
                          auVar59._0_4_ = auVar39._0_4_ + *pfVar23 + auVar47._0_4_;
                          auVar59._4_4_ = auVar39._4_4_ + pfVar23[1] + auVar47._4_4_;
                          auVar59._8_4_ = auVar39._8_4_ + pfVar23[2] + auVar47._8_4_;
                          auVar59._12_4_ = auVar39._12_4_ + pfVar23[3] + auVar47._12_4_;
                          auVar39 = vsubps_avx(auVar39,auVar47);
                          pfVar23 = (float *)(lVar16 + local_1f8 + lVar29 * 4);
                          auVar48._0_4_ = auVar39._0_4_ + *pfVar23;
                          auVar48._4_4_ = auVar39._4_4_ + pfVar23[1];
                          auVar48._8_4_ = auVar39._8_4_ + pfVar23[2];
                          auVar48._12_4_ = auVar39._12_4_ + pfVar23[3];
                          *(undefined1 (*) [16])((long)local_1a0 + lVar25) = auVar59;
                          *(undefined1 (*) [16])(auStack_160 + lVar25) = auVar48;
                          lVar16 = lVar16 + (long)local_348 * 4;
                          lVar25 = lVar25 + 0x10;
                        } while (lVar25 != 0);
                        iVar9 = iVar14 % local_350;
                        uVar10 = (iVar14 / local_350) * 2;
                        pauVar20 = (undefined1 (*) [16])
                                   ((long)local_2d0->data +
                                   (long)(iVar9 * 2 * iVar17) * 4 +
                                   (long)local_2d0->w * local_2d0->elemsize * (long)(int)uVar10 +
                                   local_2d0->cstep * (long)local_390 * local_2d0->elemsize);
                        iVar14 = iVar9 * 2 + 1;
                        pfVar23 = &fStack_1b0;
                        lVar16 = 0;
                        do {
                          if ((int)(uVar10 | (uint)lVar16) < iVar31) {
                            auVar49._0_4_ = fVar38 + pfVar23[-8];
                            auVar49._4_4_ = fVar40 + pfVar23[-7];
                            auVar49._8_4_ = fVar41 + pfVar23[-6];
                            auVar49._12_4_ = fVar42 + pfVar23[-5];
                            auVar39 = *(undefined1 (*) [16])(pfVar23 + -4);
                            auVar55._0_4_ = auVar49._0_4_ + pfVar23[-0xc] + auVar39._0_4_;
                            auVar55._4_4_ = auVar49._4_4_ + pfVar23[-0xb] + auVar39._4_4_;
                            auVar55._8_4_ = auVar49._8_4_ + pfVar23[-10] + auVar39._8_4_;
                            auVar55._12_4_ = auVar49._12_4_ + pfVar23[-9] + auVar39._12_4_;
                            auVar39 = vsubps_avx(auVar49,auVar39);
                            auVar50._0_4_ = auVar39._0_4_ + *pfVar23;
                            auVar50._4_4_ = auVar39._4_4_ + pfVar23[1];
                            auVar50._8_4_ = auVar39._8_4_ + pfVar23[2];
                            auVar50._12_4_ = auVar39._12_4_ + pfVar23[3];
                            if (iVar17 == 1) {
                              *(float *)*pauVar20 = auVar55._0_4_;
                              uVar8 = vextractps_avx(auVar55,1);
                              *(undefined4 *)(*pauVar20 + (long)local_378 * 4) = uVar8;
                              uVar8 = vextractps_avx(auVar55,2);
                              *(undefined4 *)(*pauVar20 + local_388 * 4) = uVar8;
                              uVar8 = vextractps_avx(auVar55,3);
                              *(undefined4 *)(*pauVar20 + (long)(int)(uVar30 * 3) * 4) = uVar8;
                              if (iVar14 < iVar13) {
                                *(float *)(*pauVar20 + 4) = auVar50._0_4_;
                                uVar8 = vextractps_avx(auVar50,1);
                                *(undefined4 *)(*pauVar20 + (long)local_378 * 4 + 4) = uVar8;
                                uVar8 = vextractps_avx(auVar50,2);
                                *(undefined4 *)(*pauVar20 + local_388 * 4 + 4) = uVar8;
                                uVar8 = vextractps_avx(auVar50,3);
                                *(undefined4 *)(*pauVar20 + (long)(int)(uVar30 * 3) * 4 + 4) = uVar8
                                ;
                              }
                            }
                            else if ((iVar17 == 4) && (*pauVar20 = auVar55, iVar14 < iVar13)) {
                              pauVar20[1] = auVar50;
                            }
                            pauVar20 = (undefined1 (*) [16])
                                       (*pauVar20 + (long)(iVar17 * iVar13) * 4);
                          }
                          lVar16 = lVar16 + 1;
                          pfVar23 = pfVar23 + 0x10;
                        } while (lVar16 == 1);
                        lVar15 = lVar15 + 0x10;
                        pvVar12 = (void *)((long)local_380 + 1U);
                      } while ((void *)((long)local_380 + 1U) != local_398);
                    }
                    uVar33 = uVar33 + iVar28 * 0x40;
                    pvVar12 = (void *)((long)local_2e8 + 4U);
                  } while ((long)((long)local_2e8 + 7U) < local_1f0);
                  uVar35 = (long)local_2e8 + 4U & 0xffffffff;
                }
                uVar33 = (uint)uVar35;
                if ((int)(uVar33 | 1) < (int)uVar32) {
                  local_398 = local_2a0.data;
                  local_2e8 = local_2d0->data;
                  local_2d8 = local_2d0->cstep * local_2d0->elemsize;
                  local_388 = (long)local_2d0->w * local_2d0->elemsize;
                  local_380 = (void *)((long)local_360 + local_2f0 * 4);
                  uVar33 = uVar33 * iVar28 * 0x10;
                  local_390 = (Option *)CONCAT44(local_390._4_4_,iVar28 * 0x20);
                  uVar35 = uVar35 & 0xffffffff;
                  do {
                    local_368 = (ulong)uVar33;
                    fVar38 = 0.0;
                    fVar40 = 0.0;
                    if (local_360 != (void *)0x0) {
                      fVar40 = *(float *)((long)local_380 + uVar35 * 4);
                      fVar38 = *(float *)((long)local_380 + uVar35 * 4 + 4);
                    }
                    if (0 < iVar28) {
                      puVar21 = (undefined8 *)((long)local_2a0.data + (long)(int)uVar33 * 4);
                      local_378 = (Mat *)((local_2f0 + uVar35) * local_2d8 + (long)local_2e8);
                      uVar26 = 0;
                      do {
                        iVar17 = iVar18 + (int)uVar26;
                        lVar29 = -0x20;
                        puVar22 = puVar21;
                        do {
                          uVar3 = *(ulong *)((long)puVar22 + (long)(iVar28 * 2) * 4);
                          auVar60._8_8_ = 0;
                          auVar60._0_8_ = uVar3;
                          uVar4 = *(ulong *)((long)puVar22 + (long)(iVar28 * 4) * 4);
                          auVar62._8_8_ = 0;
                          auVar62._0_8_ = uVar4;
                          auVar56._0_4_ = (float)uVar3 + (float)*puVar22 + (float)uVar4;
                          auVar56._4_4_ =
                               (float)(uVar3 >> 0x20) + (float)((ulong)*puVar22 >> 0x20) +
                               (float)(uVar4 >> 0x20);
                          auVar56._8_8_ = 0;
                          uVar5 = vmovlps_avx(auVar56);
                          *(undefined8 *)((long)&local_1c0 + lVar29) = uVar5;
                          auVar39 = vsubps_avx(auVar60,auVar62);
                          uVar5 = *(undefined8 *)((long)puVar22 + (long)(iVar28 * 6) * 4);
                          auVar57._0_4_ = auVar39._0_4_ + (float)uVar5;
                          auVar57._4_4_ = auVar39._4_4_ + (float)((ulong)uVar5 >> 0x20);
                          auVar57._8_4_ = auVar39._8_4_ + 0.0;
                          auVar57._12_4_ = auVar39._12_4_ + 0.0;
                          uVar5 = vmovlps_avx(auVar57);
                          *(undefined8 *)((long)local_1a0 + lVar29) = uVar5;
                          puVar22 = (undefined8 *)((long)puVar22 + (long)(iVar28 * 8) * 4);
                          lVar29 = lVar29 + 8;
                        } while (lVar29 != 0);
                        iVar14 = iVar17 % local_350;
                        uVar10 = (iVar17 / local_350) * 2;
                        pfVar23 = (float *)((long)&local_378->data +
                                           (long)(iVar14 * 2) * 4 + (long)(int)uVar10 * local_388);
                        pfVar27 = afStack_1c8 + 1;
                        lVar29 = 0;
                        do {
                          if ((int)(uVar10 | (uint)lVar29) < iVar31) {
                            fVar41 = pfVar27[-3];
                            fVar42 = pfVar27[-2];
                            fVar43 = pfVar27[-1];
                            fVar44 = pfVar27[-5];
                            fVar45 = *pfVar27;
                            fVar46 = pfVar27[-4];
                            fVar1 = pfVar27[-6];
                            *pfVar23 = fVar40 + fVar44 + pfVar27[-7] + fVar41;
                            pfVar23[(int)uVar30] = fVar38 + fVar46 + fVar1 + fVar42;
                            if (iVar14 * 2 + 1 < iVar13) {
                              pfVar23[1] = ((fVar40 + fVar44) - fVar41) + fVar43;
                              pfVar23[(long)(int)uVar30 + 1] = ((fVar38 + fVar46) - fVar42) + fVar45
                              ;
                            }
                            pfVar23 = pfVar23 + iVar13;
                          }
                          lVar29 = lVar29 + 1;
                          pfVar27 = pfVar27 + 8;
                        } while (lVar29 == 1);
                        uVar26 = uVar26 + 1;
                        puVar21 = puVar21 + 1;
                      } while (uVar26 != (local_370 & 0xffffffff));
                    }
                    uVar26 = uVar35 + 2;
                    lVar29 = uVar35 + 3;
                    uVar33 = uVar33 + iVar28 * 0x20;
                    uVar35 = uVar26;
                  } while (lVar29 < local_1f0);
                  uVar33 = (uint)uVar26;
                }
                if ((int)uVar33 < (int)uVar32) {
                  local_380 = local_2d0->data;
                  local_390 = (Option *)(local_2d0->cstep * local_2d0->elemsize);
                  local_378 = (Mat *)((long)local_2d0->w * local_2d0->elemsize);
                  lVar29 = (long)(int)uVar33;
                  local_398 = (void *)((long)local_360 + local_2f0 * 4);
                  local_388 = local_370 & 0xffffffff;
                  uVar30 = uVar33 * iVar28 * 0x10;
                  do {
                    local_368 = (ulong)uVar30;
                    if (local_360 == (void *)0x0) {
                      fVar38 = 0.0;
                    }
                    else {
                      fVar38 = *(float *)((long)local_398 + lVar29 * 4);
                    }
                    if (0 < iVar28) {
                      pfVar23 = (float *)((long)local_2a0.data + (long)(int)uVar30 * 4);
                      uVar35 = 0;
                      do {
                        iVar17 = iVar18 + (int)uVar35;
                        lVar15 = -0x10;
                        pfVar27 = pfVar23;
                        do {
                          fVar40 = pfVar27[iVar28];
                          fVar41 = pfVar27[iVar28 * 2];
                          *(float *)((long)&uStack_1d0 + lVar15) = fVar40 + *pfVar27 + fVar41;
                          *(float *)((long)&local_1c0 + lVar15) =
                               (fVar40 - fVar41) + pfVar27[iVar28 * 3];
                          pfVar27 = pfVar27 + iVar28 * 4;
                          lVar15 = lVar15 + 4;
                        } while (lVar15 != 0);
                        iVar14 = iVar17 % local_350;
                        uVar33 = (iVar17 / local_350) * 2;
                        pfVar27 = (float *)((long)local_380 +
                                           (long)(iVar14 * 2) * 4 +
                                           (long)(int)uVar33 * (long)local_378 +
                                           (local_2f0 + lVar29) * (long)local_390);
                        pfVar24 = afStack_1d8 + 1;
                        lVar15 = 0;
                        do {
                          if ((int)(uVar33 | (uint)lVar15) < iVar31) {
                            fVar40 = pfVar24[-1];
                            fVar41 = pfVar24[-2];
                            fVar42 = *pfVar24;
                            *pfVar27 = fVar38 + fVar41 + pfVar24[-3] + fVar40;
                            if (iVar14 * 2 + 1 < iVar13) {
                              pfVar27[1] = ((fVar38 + fVar41) - fVar40) + fVar42;
                            }
                            pfVar27 = pfVar27 + iVar13;
                          }
                          lVar15 = lVar15 + 1;
                          pfVar24 = pfVar24 + 4;
                        } while (lVar15 == 1);
                        uVar35 = uVar35 + 1;
                        pfVar23 = pfVar23 + 1;
                      } while (uVar35 != local_388);
                    }
                    lVar29 = lVar29 + 1;
                    uVar30 = uVar30 + local_348;
                  } while (lVar29 != local_1f0);
                }
                uVar35 = (ulong)(iVar18 + local_39c);
              } while ((int)(iVar18 + local_39c) < (int)local_2c0);
            }
            piVar11 = (int *)CONCAT44(local_2a0.refcount._4_4_,local_2a0.refcount._0_4_);
            if (piVar11 != (int *)0x0) {
              LOCK();
              *piVar11 = *piVar11 + -1;
              UNLOCK();
              if (*piVar11 == 0) {
                if (local_2a0.allocator == (Allocator *)0x0) {
                  if (local_2a0.data != (void *)0x0) {
                    free(local_2a0.data);
                  }
                }
                else {
                  (*(local_2a0.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_2a0.cstep = 0;
            local_2a0.data = (void *)0x0;
            local_2a0.refcount._0_4_ = 0;
            local_2a0.refcount._4_4_ = 0;
            local_2a0.elemsize = 0;
            local_2a0.elempack = 0;
            local_2a0.dims = 0;
            local_2a0.w = 0;
            local_2a0.h = 0;
            local_2a0.d = 0;
            local_2a0.c = 0;
            local_34c = local_34c + 1;
          } while (local_34c != local_2c4);
        }
        iVar28 = 0;
      }
      piVar11 = (int *)CONCAT44(local_340.refcount._4_4_,local_340.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_340.allocator == (Allocator *)0x0) {
            if (local_340.data != (void *)0x0) {
              free(local_340.data);
            }
          }
          else {
            (*(local_340.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_340.cstep = 0;
      local_340.data = (void *)0x0;
      local_340.refcount._0_4_ = 0;
      local_340.refcount._4_4_ = 0;
      local_340.elemsize = 0;
      local_340.elempack = 0;
      local_340.dims = 0;
      local_340.w = 0;
      local_340.h = 0;
      local_340.d = 0;
      local_340.c = 0;
      goto LAB_002195a1;
    }
    piVar11 = (int *)CONCAT44(afStack_1d8[1],afStack_1d8[0]);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_1c0 == (Allocator *)0x0) {
LAB_002182dc:
          if (local_1e0 != (undefined1  [8])0x0) {
            free((void *)local_1e0);
          }
        }
        else {
          (*local_1c0->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_1a0[0] = 0;
  local_1e0 = (undefined1  [8])0x0;
  afStack_1d8[0] = 0.0;
  afStack_1d8[1] = 0.0;
  uStack_1d0 = 0;
  afStack_1c8[0] = 0.0;
  iStack_1b8 = 0;
  iStack_1b4 = 0;
  fStack_1b0 = 0.0;
  iStack_1ac = 0;
  iStack_1a8 = 0;
LAB_002195a1:
  piVar11 = (int *)CONCAT44(local_250.refcount._4_4_,local_250.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_250.allocator == (Allocator *)0x0) {
        if (local_250.data != (void *)0x0) {
          free(local_250.data);
        }
      }
      else {
        (*(local_250.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

static int conv3x3s1_winograd23(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 2n+2, winograd F(2,3)
    int w_tiles = (outw + 1) / 2;
    int h_tiles = (outh + 1) / 2;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 16;

    // NCNN_LOGE("conv3x3s1_winograd23 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd23_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }

    return 0;
}